

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UMatchDegree __thiscall
icu_63::UnicodeSet::matches
          (UnicodeSet *this,Replaceable *text,int32_t *offset,int32_t limit,UBool incremental)

{
  bool bVar1;
  UBool UVar2;
  char16_t cVar3;
  char16_t cVar4;
  int32_t iVar5;
  int32_t iVar6;
  UnicodeString *this_00;
  int local_80;
  int local_78;
  int32_t local_74;
  int32_t maxLen;
  int32_t matchLen;
  UChar c;
  UnicodeString *trial;
  int32_t highWaterLength;
  UChar firstChar;
  UBool forward;
  int32_t i;
  UBool incremental_local;
  int32_t limit_local;
  int32_t *offset_local;
  Replaceable *text_local;
  UnicodeSet *this_local;
  
  if (*offset == limit) {
    UVar2 = contains(this,0xffff);
    if (UVar2 == '\0') {
      this_local._4_4_ = U_MISMATCH;
    }
    else {
      this_local._4_4_ = U_MATCH;
      if (incremental != '\0') {
        this_local._4_4_ = U_PARTIAL_MATCH;
      }
    }
  }
  else {
    iVar5 = UVector::size(this->strings);
    if (iVar5 != 0) {
      bVar1 = *offset < limit;
      cVar3 = Replaceable::charAt(text,*offset);
      trial._4_4_ = 0;
      for (highWaterLength = 0; iVar5 = UVector::size(this->strings), highWaterLength < iVar5;
          highWaterLength = highWaterLength + 1) {
        this_00 = (UnicodeString *)UVector::elementAt(this->strings,highWaterLength);
        if (bVar1) {
          local_74 = 0;
        }
        else {
          iVar5 = UnicodeString::length(this_00);
          local_74 = iVar5 + -1;
        }
        cVar4 = UnicodeString::charAt(this_00,local_74);
        if ((bVar1) && ((ushort)cVar3 < (ushort)cVar4)) break;
        if (cVar4 == cVar3) {
          iVar5 = matchRest(text,*offset,limit,this_00);
          if (incremental != '\0') {
            if (bVar1) {
              local_78 = limit - *offset;
            }
            else {
              local_78 = *offset - limit;
            }
            if (iVar5 == local_78) {
              return U_PARTIAL_MATCH;
            }
          }
          iVar6 = UnicodeString::length(this_00);
          if (iVar5 == iVar6) {
            if (trial._4_4_ < iVar5) {
              trial._4_4_ = iVar5;
            }
            if ((bVar1) && (iVar5 < trial._4_4_)) break;
          }
        }
      }
      if (trial._4_4_ != 0) {
        if (bVar1) {
          local_80 = trial._4_4_;
        }
        else {
          local_80 = -trial._4_4_;
        }
        *offset = local_80 + *offset;
        return U_MATCH;
      }
    }
    this_local._4_4_ =
         UnicodeFilter::matches(&this->super_UnicodeFilter,text,offset,limit,incremental);
  }
  return this_local._4_4_;
}

Assistant:

UMatchDegree UnicodeSet::matches(const Replaceable& text,
                                 int32_t& offset,
                                 int32_t limit,
                                 UBool incremental) {
    if (offset == limit) {
        // Strings, if any, have length != 0, so we don't worry
        // about them here.  If we ever allow zero-length strings
        // we much check for them here.
        if (contains(U_ETHER)) {
            return incremental ? U_PARTIAL_MATCH : U_MATCH;
        } else {
            return U_MISMATCH;
        }
    } else {
        if (strings->size() != 0) { // try strings first

            // might separate forward and backward loops later
            // for now they are combined

            // TODO Improve efficiency of this, at least in the forward
            // direction, if not in both.  In the forward direction we
            // can assume the strings are sorted.

            int32_t i;
            UBool forward = offset < limit;

            // firstChar is the leftmost char to match in the
            // forward direction or the rightmost char to match in
            // the reverse direction.
            UChar firstChar = text.charAt(offset);

            // If there are multiple strings that can match we
            // return the longest match.
            int32_t highWaterLength = 0;

            for (i=0; i<strings->size(); ++i) {
                const UnicodeString& trial = *(const UnicodeString*)strings->elementAt(i);

                //if (trial.length() == 0) {
                //    return U_MATCH; // null-string always matches
                //}
                // assert(trial.length() != 0); // We ensure this elsewhere

                UChar c = trial.charAt(forward ? 0 : trial.length() - 1);

                // Strings are sorted, so we can optimize in the
                // forward direction.
                if (forward && c > firstChar) break;
                if (c != firstChar) continue;

                int32_t matchLen = matchRest(text, offset, limit, trial);

                if (incremental) {
                    int32_t maxLen = forward ? limit-offset : offset-limit;
                    if (matchLen == maxLen) {
                        // We have successfully matched but only up to limit.
                        return U_PARTIAL_MATCH;
                    }
                }

                if (matchLen == trial.length()) {
                    // We have successfully matched the whole string.
                    if (matchLen > highWaterLength) {
                        highWaterLength = matchLen;
                    }
                    // In the forward direction we know strings
                    // are sorted so we can bail early.
                    if (forward && matchLen < highWaterLength) {
                        break;
                    }
                    continue;
                }
            }

            // We've checked all strings without a partial match.
            // If we have full matches, return the longest one.
            if (highWaterLength != 0) {
                offset += forward ? highWaterLength : -highWaterLength;
                return U_MATCH;
            }
        }
        return UnicodeFilter::matches(text, offset, limit, incremental);
    }
}